

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTGame.cpp
# Opt level: O2

string * __thiscall TTTGame::GetName_abi_cxx11_(string *__return_storage_ptr__,TTTGame *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  return __return_storage_ptr__;
}

Assistant:

string TTTGame::GetName() const {
    return m_name;
}